

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanLogicalDevice::WaitIdle(VulkanLogicalDevice *this)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  VkResult err;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._12_4_ = (*vkDeviceWaitIdle)(this->m_VkDevice);
  if (msg.field_2._12_4_ != VK_SUCCESS) {
    Diligent::FormatString<char[22]>((string *)local_38,(char (*) [22])"Failed to idle device");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"WaitIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x9a);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void VulkanLogicalDevice::WaitIdle() const
{
    VkResult err = vkDeviceWaitIdle(m_VkDevice);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to idle device");
    (void)err;
}